

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O0

int __thiscall ll_grammar::GrammarLeft::find_name(GrammarLeft *this,string *name_of_elem)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Self local_30;
  _Self local_28;
  int local_1c;
  string *psStack_18;
  int result;
  string *name_of_elem_local;
  GrammarLeft *this_local;
  
  local_1c = -2;
  psStack_18 = name_of_elem;
  name_of_elem_local = (string *)this;
  bVar1 = std::operator==(name_of_elem,"@");
  if (bVar1) {
    local_1c = -1;
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->name_of_keys,name_of_elem);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->name_of_keys);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->name_of_keys,name_of_elem);
      local_1c = *pmVar2;
    }
  }
  return local_1c;
}

Assistant:

int GrammarLeft::find_name(string name_of_elem){
    int result = -2;
    if (name_of_elem == "@"){
        result = -1;
    }
    else
    {
        if (this->name_of_keys.find(name_of_elem) != name_of_keys.end()){
            result = name_of_keys[name_of_elem];
        }
    }

    return result;
}